

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::SceneLoader::end__axis____common_sidref_or_param_type(SceneLoader *this)

{
  KinematicsSidrefOrParam::setParamValue
            (&this->mCurrentBindJointAxis->mAxis,&this->mCurrentCharacterData);
  (this->mCurrentCharacterData)._M_string_length = 0;
  *(this->mCurrentCharacterData)._M_dataplus._M_p = '\0';
  return true;
}

Assistant:

bool SceneLoader::end__axis____common_sidref_or_param_type()
	{
		mCurrentBindJointAxis->getAxis().setParamValue(mCurrentCharacterData);
		mCurrentCharacterData.clear();
		return true;
	}